

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::anon_unknown_1::HaveKeys
          (anon_unknown_1 *this,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *pubkeys,LegacyDataSPKM *keystore)

{
  char cVar1;
  valtype *pubkey;
  long in_FS_OFFSET;
  CKeyID keyID;
  CPubKey local_85;
  CKeyID local_44;
  long local_30;
  int iVar2;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == (anon_unknown_1 *)pubkeys) {
    cVar1 = '\x01';
  }
  else {
    do {
      CPubKey::Set<unsigned_char_const*>(&local_85,*(uchar **)this,(uchar *)*(pointer *)(this + 8));
      CPubKey::GetID(&local_44,&local_85);
      iVar2 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_44);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') break;
      this = this + 0x18;
    } while (this != (anon_unknown_1 *)pubkeys);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)cVar1;
}

Assistant:

bool HaveKeys(const std::vector<valtype>& pubkeys, const LegacyDataSPKM& keystore)
{
    for (const valtype& pubkey : pubkeys) {
        CKeyID keyID = CPubKey(pubkey).GetID();
        if (!keystore.HaveKey(keyID)) return false;
    }
    return true;
}